

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fStencilTexturingTests.cpp
# Opt level: O0

void deqp::gles31::Functional::anon_unknown_1::drawTestPattern
               (RenderContext *renderCtx,int width,int height)

{
  pointer *this;
  code *pcVar1;
  bool bVar2;
  int iVar3;
  deUint32 dVar4;
  ProgramSources *pPVar5;
  undefined4 extraout_var;
  TestError *this_00;
  size_type sVar7;
  reference this_01;
  float *data;
  reference indices_00;
  PrimitiveList local_370;
  allocator<char> local_351;
  string local_350;
  undefined1 local_330 [8];
  VertexArrayBinding posBinding;
  string local_2d8;
  undefined1 local_2b8 [8];
  vector<unsigned_short,_std::allocator<unsigned_short>_> indices;
  vector<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_> positions;
  vector<tcu::Vector<int,_4>,_std::allocator<tcu::Vector<int,_4>_>_> rects;
  Functions *gl;
  string local_260;
  ShaderSource local_240;
  allocator<char> local_201;
  string local_200;
  ShaderSource local_1e0;
  ProgramSources local_1b8;
  undefined1 local_e8 [8];
  ShaderProgram program;
  int height_local;
  int width_local;
  RenderContext *renderCtx_local;
  long lVar6;
  
  program.m_program.m_info.linkTimeUs._0_4_ = height;
  program.m_program.m_info.linkTimeUs._4_4_ = width;
  glu::ProgramSources::ProgramSources(&local_1b8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_200,
             "#version 300 es\nin highp vec4 a_position;\nvoid main (void)\n{\n\tgl_Position = a_position;\n}\n"
             ,&local_201);
  glu::VertexSource::VertexSource((VertexSource *)&local_1e0,&local_200);
  pPVar5 = glu::ProgramSources::operator<<(&local_1b8,&local_1e0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_260,"#version 300 es\nvoid main (void) {}\n",
             (allocator<char> *)((long)&gl + 7));
  glu::FragmentSource::FragmentSource((FragmentSource *)&local_240,&local_260);
  pPVar5 = glu::ProgramSources::operator<<(pPVar5,&local_240);
  glu::ShaderProgram::ShaderProgram((ShaderProgram *)local_e8,renderCtx,pPVar5);
  glu::FragmentSource::~FragmentSource((FragmentSource *)&local_240);
  std::__cxx11::string::~string((string *)&local_260);
  std::allocator<char>::~allocator((allocator<char> *)((long)&gl + 7));
  glu::VertexSource::~VertexSource((VertexSource *)&local_1e0);
  std::__cxx11::string::~string((string *)&local_200);
  std::allocator<char>::~allocator(&local_201);
  glu::ProgramSources::~ProgramSources(&local_1b8);
  iVar3 = (*renderCtx->_vptr_RenderContext[3])();
  lVar6 = CONCAT44(extraout_var,iVar3);
  std::vector<tcu::Vector<int,_4>,_std::allocator<tcu::Vector<int,_4>_>_>::vector
            ((vector<tcu::Vector<int,_4>,_std::allocator<tcu::Vector<int,_4>_>_> *)
             &positions.
              super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage);
  std::vector<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>::vector
            ((vector<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_> *)
             &indices.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  std::vector<unsigned_short,_std::allocator<unsigned_short>_>::vector
            ((vector<unsigned_short,_std::allocator<unsigned_short>_> *)local_2b8);
  bVar2 = glu::ShaderProgram::isOk((ShaderProgram *)local_e8);
  if (!bVar2) {
    posBinding.pointer.data._6_1_ = 1;
    this_00 = (TestError *)__cxa_allocate_exception(0x38);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_2d8,"Compile failed",
               (allocator<char> *)((long)&posBinding.pointer.data + 7));
    tcu::TestError::TestError(this_00,&local_2d8);
    posBinding.pointer.data._6_1_ = 0;
    __cxa_throw(this_00,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
  }
  pcVar1 = *(code **)(lVar6 + 0x1680);
  dVar4 = glu::ShaderProgram::getProgram((ShaderProgram *)local_e8);
  (*pcVar1)(dVar4);
  (**(code **)(lVar6 + 0x1a00))
            (0,0,program.m_program.m_info.linkTimeUs._4_4_,(int)program.m_program.m_info.linkTimeUs)
  ;
  (**(code **)(lVar6 + 0x188))(0x400);
  (**(code **)(lVar6 + 0x5e0))(0xb90);
  (**(code **)(lVar6 + 0x12e8))(0x1e00,0x1e00,0x8507);
  (**(code **)(lVar6 + 0x12c8))(0x207,0,0xffffffff);
  dVar4 = (**(code **)(lVar6 + 0x800))();
  glu::checkError(dVar4,"State setup failed",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fStencilTexturingTests.cpp"
                  ,0x97);
  genTestRects((vector<tcu::Vector<int,_4>,_std::allocator<tcu::Vector<int,_4>_>_> *)
               &positions.
                super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>.
                _M_impl.super__Vector_impl_data._M_end_of_storage,
               program.m_program.m_info.linkTimeUs._4_4_,(int)program.m_program.m_info.linkTimeUs);
  rectsToTriangles((vector<tcu::Vector<int,_4>,_std::allocator<tcu::Vector<int,_4>_>_> *)
                   &positions.
                    super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage,
                   program.m_program.m_info.linkTimeUs._4_4_,
                   (int)program.m_program.m_info.linkTimeUs,
                   (vector<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_> *)
                   &indices.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
                    _M_impl.super__Vector_impl_data._M_end_of_storage,
                   (vector<unsigned_short,_std::allocator<unsigned_short>_> *)local_2b8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_350,"a_position",&local_351);
  this = &indices.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage;
  sVar7 = std::vector<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>::size
                    ((vector<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_> *)this)
  ;
  this_01 = std::vector<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>::operator[]
                      ((vector<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_> *)
                       this,0);
  data = tcu::Vector<float,_2>::getPtr(this_01);
  glu::va::Float((VertexArrayBinding *)local_330,&local_350,2,(int)sVar7,0,data);
  std::__cxx11::string::~string((string *)&local_350);
  std::allocator<char>::~allocator(&local_351);
  dVar4 = glu::ShaderProgram::getProgram((ShaderProgram *)local_e8);
  sVar7 = std::vector<unsigned_short,_std::allocator<unsigned_short>_>::size
                    ((vector<unsigned_short,_std::allocator<unsigned_short>_> *)local_2b8);
  indices_00 = std::vector<unsigned_short,_std::allocator<unsigned_short>_>::operator[]
                         ((vector<unsigned_short,_std::allocator<unsigned_short>_> *)local_2b8,0);
  glu::pr::Triangles(&local_370,(int)sVar7,indices_00);
  glu::draw(renderCtx,dVar4,1,(VertexArrayBinding *)local_330,&local_370,(DrawUtilCallback *)0x0);
  glu::VertexArrayBinding::~VertexArrayBinding((VertexArrayBinding *)local_330);
  (**(code **)(lVar6 + 0x4e8))(0xb90);
  std::vector<unsigned_short,_std::allocator<unsigned_short>_>::~vector
            ((vector<unsigned_short,_std::allocator<unsigned_short>_> *)local_2b8);
  std::vector<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>::~vector
            ((vector<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_> *)
             &indices.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  std::vector<tcu::Vector<int,_4>,_std::allocator<tcu::Vector<int,_4>_>_>::~vector
            ((vector<tcu::Vector<int,_4>,_std::allocator<tcu::Vector<int,_4>_>_> *)
             &positions.
              super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage);
  glu::ShaderProgram::~ShaderProgram((ShaderProgram *)local_e8);
  return;
}

Assistant:

static void drawTestPattern (const glu::RenderContext& renderCtx, int width, int height)
{
	const glu::ShaderProgram program(renderCtx, glu::ProgramSources()
		<< glu::VertexSource(
			"#version 300 es\n"
			"in highp vec4 a_position;\n"
			"void main (void)\n"
			"{\n"
			"	gl_Position = a_position;\n"
			"}\n")
		<< glu::FragmentSource(
			"#version 300 es\n"
			"void main (void) {}\n"));

	const glw::Functions&	gl		= renderCtx.getFunctions();
	vector<IVec4>			rects;
	vector<Vec2>			positions;
	vector<deUint16>		indices;

	if (!program.isOk())
		throw tcu::TestError("Compile failed");

	gl.useProgram	(program.getProgram());
	gl.viewport		(0, 0, width, height);
	gl.clear		(GL_STENCIL_BUFFER_BIT);
	gl.enable		(GL_STENCIL_TEST);
	gl.stencilOp	(GL_KEEP, GL_KEEP, GL_INCR_WRAP);
	gl.stencilFunc	(GL_ALWAYS, 0, ~0u);
	GLU_EXPECT_NO_ERROR(gl.getError(), "State setup failed");

	genTestRects	(rects, width, height);
	rectsToTriangles(rects, width, height, positions, indices);

	{
		const glu::VertexArrayBinding posBinding = glu::va::Float("a_position", 2, (int)positions.size(), 0, positions[0].getPtr());
		glu::draw(renderCtx, program.getProgram(), 1, &posBinding, glu::pr::Triangles((int)indices.size(), &indices[0]));
	}

	gl.disable(GL_STENCIL_TEST);
}